

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_extsym(CTState *cts,CType *ct,GCstr *name)

{
  CType *ctf;
  GCstr *name_local;
  CType *ct_local;
  CTState *cts_local;
  
  if ((ct->sib == 0) || ((cts->tab[ct->sib].info & 0xf0ff0000) != 0x80040000)) {
    cts_local = (CTState *)(name + 1);
  }
  else {
    cts_local = (CTState *)(cts->tab[ct->sib].name.gcptr64 + 0x18);
  }
  return (char *)cts_local;
}

Assistant:

static const char *clib_extsym(CTState *cts, CType *ct, GCstr *name)
{
  if (ct->sib) {
    CType *ctf = ctype_get(cts, ct->sib);
    if (ctype_isxattrib(ctf->info, CTA_REDIR))
      return strdata(gco2str(gcref(ctf->name)));
  }
  return strdata(name);
}